

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O0

void __thiscall
chaiscript::dispatch::Proxy_Function_Callable_Impl<double_(),_double_(*)()>::
Proxy_Function_Callable_Impl
          (Proxy_Function_Callable_Impl<double_(),_double_(*)()> *this,_func_double *f)

{
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> local_30;
  _func_double *local_18;
  _func_double *f_local;
  Proxy_Function_Callable_Impl<double_(),_double_(*)()> *this_local;
  
  local_18 = f;
  f_local = (_func_double *)this;
  detail::build_param_type_list<double>(&local_30,(_func_double *)0x0);
  Proxy_Function_Impl_Base::Proxy_Function_Impl_Base
            (&this->super_Proxy_Function_Impl_Base,&local_30);
  std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::~vector(&local_30);
  (this->super_Proxy_Function_Impl_Base).super_Proxy_Function_Base._vptr_Proxy_Function_Base =
       (_func_int **)&PTR__Proxy_Function_Callable_Impl_0087b5d8;
  this->m_f = local_18;
  return;
}

Assistant:

explicit Proxy_Function_Callable_Impl(Callable f)
          : Proxy_Function_Impl_Base(detail::build_param_type_list(static_cast<Func *>(nullptr)))
          , m_f(std::move(f)) {
      }